

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLDCM.cpp
# Opt level: O3

Matrix33 *
AML::dcmKinematicRates_BodyRates(Matrix33 *__return_storage_ptr__,Matrix33 *dcm,Vector3 *bodyRates)

{
  Matrix33 skewMatrix;
  double local_f8;
  double local_f0;
  double local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  uint uStack_cc;
  undefined4 uStack_c8;
  uint uStack_c4;
  undefined4 local_c0;
  uint uStack_bc;
  undefined8 local_b8;
  Matrix33 local_b0;
  Matrix33 local_68;
  
  local_f8 = 0.0;
  local_f0 = -(bodyRates->field_0).data[2];
  local_d8 = 0;
  local_d0 = *(undefined4 *)&bodyRates->field_0;
  uStack_bc = *(uint *)((long)&bodyRates->field_0 + 4);
  uStack_c8 = *(undefined4 *)((bodyRates->field_0).data + 1);
  local_e0 = (bodyRates->field_0).data[1];
  uStack_cc = uStack_bc ^ 0x80000000;
  uStack_c4 = *(uint *)((long)&bodyRates->field_0 + 0xc) ^ 0x80000000;
  local_b8 = 0;
  local_c0 = local_d0;
  Matrix33::Matrix33(&local_68,&local_f8);
  operator-(&local_68);
  operator*(__return_storage_ptr__,&local_b0,dcm);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 dcmKinematicRates_BodyRates(const Matrix33& dcm, const Vector3& bodyRates)
    {
        const double p = bodyRates.x;
        const double q = bodyRates.y;
        const double r = bodyRates.z;
        const double skewMatrixData[9] = { 0.0, -r, q, r, 0.0, -p, -q, p, 0.0 };
        const Matrix33 skewMatrix = Matrix33(skewMatrixData);
        return -skewMatrix * dcm;
    }